

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFlatImageLevel.cpp
# Opt level: O0

FlatImageChannel * __thiscall
Imf_2_5::FlatImageLevel::findChannel(FlatImageLevel *this,string *name)

{
  bool bVar1;
  pointer ppVar2;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::FlatImageChannel_*>_>
  *in_RDI;
  const_iterator i;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::FlatImageChannel_*>_>_>
  *in_stack_ffffffffffffffc8;
  _Self local_28;
  _Self local_20 [3];
  FlatImageChannel *local_8;
  
  local_20[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::FlatImageChannel_*>_>_>
       ::find(in_stack_ffffffffffffffc8,(key_type *)0x124f36);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::FlatImageChannel_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::FlatImageChannel_*>_>_>
       ::end(in_stack_ffffffffffffffc8);
  bVar1 = std::operator!=(local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Imf_2_5::FlatImageChannel_*>_>
             ::operator->(in_RDI);
    local_8 = ppVar2->second;
  }
  else {
    local_8 = (FlatImageChannel *)0x0;
  }
  return local_8;
}

Assistant:

const FlatImageChannel *
FlatImageLevel::findChannel (const string& name) const
{
    ChannelMap::const_iterator i = _channels.find (name);

    if (i != _channels.end())
        return i->second;
    else
        return 0;
}